

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompileType<unsigned_char>(void)

{
  undefined1 uVar1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  uchar result;
  uchar x;
  bool b2;
  uchar *p4;
  uchar *p3;
  uchar *r;
  uchar *p2;
  uchar *p1;
  longdouble ld;
  double d;
  float f;
  size_t size;
  wchar_t w;
  bool b;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> sb;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  uchar t;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> i;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> s;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffff88;
  SafeInt *this;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_b;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_a;
  uchar local_9 [8];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1;
  
  this = (SafeInt *)&local_1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *)this);
  local_9[1] = '\0';
  local_9[2] = '\0';
  local_9[3] = '\0';
  local_9[4] = '\0';
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<Foo>((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)this,(Foo *)in_stack_ffffffffffffff88);
  local_9[0] = '\0';
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_a,local_9);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_b,false);
  CompiledMixedType<unsigned_char,char>();
  CompiledMixedType<unsigned_char,signed_char>();
  CompiledMixedType<unsigned_char,unsigned_char>();
  CompiledMixedType<unsigned_char,short>();
  CompiledMixedType<unsigned_char,unsigned_short>();
  CompiledMixedType<unsigned_char,int>();
  CompiledMixedType<unsigned_char,unsigned_int>();
  CompiledMixedType<unsigned_char,long>();
  CompiledMixedType<unsigned_char,unsigned_long>();
  CompiledMixedType<unsigned_char,long_long>();
  CompiledMixedType<unsigned_char,unsigned_long_long>();
  ModulusFriendTest<unsigned_char,char>();
  ModulusFriendTest<unsigned_char,signed_char>();
  ModulusFriendTest<unsigned_char,unsigned_char>();
  ModulusFriendTest<unsigned_char,short>();
  ModulusFriendTest<unsigned_char,unsigned_short>();
  ModulusFriendTest<unsigned_char,int>();
  ModulusFriendTest<unsigned_char,unsigned_int>();
  ModulusFriendTest<unsigned_char,long>();
  ModulusFriendTest<unsigned_char,unsigned_long>();
  ModulusFriendTest<unsigned_char,long_long>();
  ModulusFriendTest<unsigned_char,unsigned_long_long>();
  SafeInt::operator_cast_to_bool(this);
  SafeInt::operator_cast_to_wchar_t
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  SafeInt::operator_cast_to_unsigned_long
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  SafeInt::operator_cast_to_float
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  SafeInt::operator_cast_to_double
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  SafeInt::operator_cast_to_long_double
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  Ptr(&local_1);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  Ptr(&local_1);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  Ref(&local_1);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&(&local_1);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&(&local_1);
  uVar1 = SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          ::operator!(&local_a);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+(&local_a);
  local_9[0] = SafeInt::operator_cast_to_unsigned_char
                         ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                           *)this);
  SVar2 = SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          ::operator++((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                  CONCAT15(in_stack_ffffffffffffff9d,
                                                           CONCAT14(in_stack_ffffffffffffff9c,
                                                                    in_stack_ffffffffffffff98)))),
                       (int)((ulong)this >> 0x20));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator++((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator--((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(uVar1,CONCAT16(SVar2.m_int,
                                        CONCAT15(in_stack_ffffffffffffff9d,
                                                 CONCAT14(in_stack_ffffffffffffff9c,
                                                          in_stack_ffffffffffffff98)))),
             (int)((ulong)this >> 0x20));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator--((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator~(in_stack_ffffffffffffff88);
  local_9[0] = SafeInt::operator_cast_to_unsigned_char
                         ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                           *)this);
  SafeNegation<unsigned_char>((uchar)((ulong)this >> 0x38),&in_stack_ffffffffffffff88->m_int);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}